

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParseFromCodedStream(MessageLite *this,CodedInputStream *input)

{
  uint uVar1;
  LogMessage *other;
  MessageLite *message;
  CodedInputStream *input_local;
  MessageLite *this_local;
  LogFinisher local_85 [13];
  string local_78;
  LogMessage local_58;
  MessageLite *local_20;
  CodedInputStream *local_18;
  bool local_9;
  
  (*this->_vptr_MessageLite[4])();
  local_20 = this;
  local_18 = input;
  uVar1 = (*this->_vptr_MessageLite[8])(this,input);
  if ((uVar1 & 1) == 0) {
    local_9 = false;
  }
  else {
    uVar1 = (*local_20->_vptr_MessageLite[5])();
    if ((uVar1 & 1) == 0) {
      message = (MessageLite *)0x7b;
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message_lite.cc"
                 ,0x7b);
      (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)"parse",(char *)local_20,message);
      other = internal::LogMessage::operator<<(&local_58,&local_78);
      internal::LogFinisher::operator=(local_85,other);
      std::__cxx11::string::~string((string *)&local_78);
      internal::LogMessage::~LogMessage(&local_58);
      local_9 = false;
    }
    else {
      local_9 = true;
    }
  }
  return local_9;
}

Assistant:

bool MessageLite::ParseFromCodedStream(io::CodedInputStream* input) {
  return InlineParseFromCodedStream(input, this);
}